

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::CeilCaseInstance::~CeilCaseInstance(CeilCaseInstance *this)

{
  CommonFunctionTestInstance::~CommonFunctionTestInstance(&this->super_CommonFunctionTestInstance);
  operator_delete(this,0x220);
  return;
}

Assistant:

CeilCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: CommonFunctionTestInstance	(context, shaderType, spec, numValues, name)
	{
	}